

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::iterate
          (IdentityGeometryShaderCase *this)

{
  ObjectTraits **__x;
  CaseType CVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  size_t sVar9;
  ostream *poVar10;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  TestError *pTVar11;
  void *pvVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  VertexArray vao;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  anon_struct_64_4_0b5d5edf *local_420;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  ContextType local_3ec;
  Surface resultWithoutGeometry;
  Surface resultWithGeometry;
  ScopedLogSection section;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  long local_310;
  undefined1 local_308 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_278;
  undefined1 local_258 [32];
  ostringstream buf;
  ChannelType CStack_234;
  ostringstream local_230 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [6];
  ios_base local_1c8 [8];
  ios_base local_1c0 [32];
  deUint32 local_1a0;
  bool local_178;
  anon_struct_64_4_0b5d5edf renderTargets [2];
  long lVar8;
  
  iVar4 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  tcu::Surface::Surface(&resultWithGeometry,0x80,0x80);
  tcu::Surface::Surface(&resultWithoutGeometry,0x80,0x80);
  renderTargets[0].name = "RenderWithGeometryShader";
  renderTargets[0].description = "Render with geometry shader";
  renderTargets[0].containsGeometryShader = true;
  _buf = RGBA;
  CStack_234 = UNORM_INT8;
  pvVar12 = (void *)resultWithGeometry.m_pixels.m_cap;
  if (resultWithGeometry.m_pixels.m_cap != 0) {
    pvVar12 = resultWithGeometry.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&renderTargets[0].surfaceAccess,(TextureFormat *)&buf,resultWithGeometry.m_width,
             resultWithGeometry.m_height,1,pvVar12);
  renderTargets[1].name = "RenderWithoutGeometryShader";
  renderTargets[1].description = "Render without geometry shader";
  renderTargets[1].containsGeometryShader = false;
  _buf = RGBA;
  CStack_234 = UNORM_INT8;
  pvVar12 = (void *)resultWithoutGeometry.m_pixels.m_cap;
  if (resultWithoutGeometry.m_pixels.m_cap != 0) {
    pvVar12 = resultWithoutGeometry.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&renderTargets[1].surfaceAccess,(TextureFormat *)&buf,resultWithoutGeometry.m_width,
             resultWithoutGeometry.m_height,1,pvVar12);
  (**(code **)(lVar8 + 0x1a00))(0,0,0x80,0x80);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xf6);
  (**(code **)(lVar8 + 0x5e0))(0xbe2);
  (**(code **)(lVar8 + 0x120))(0x302,1);
  (**(code **)(lVar8 + 0x100))(0x8006);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"set blend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xfb);
  _buf = (TextureFormat)
         ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
  std::__cxx11::ostringstream::ostringstream(local_230);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,"Tessellation level: inner ",0x1a);
  std::ostream::_M_insert<double>(14.0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,", outer ",8);
  std::ostream::_M_insert<double>(14.0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_230);
  std::ios_base::~ios_base(local_1c0);
  lVar15 = 0;
  do {
    pTVar2 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_310 = lVar15;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,renderTargets[lVar15].name,(allocator<char> *)local_498);
    local_420 = renderTargets + lVar15;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,renderTargets[lVar15].description,(allocator<char> *)&vao);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&buf,(string *)local_308);
    if (local_308._0_8_ != (long)local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    if (_buf != (TextureFormat)local_228) {
      operator_delete((void *)_buf,local_228[0]._M_allocated_capacity + 1);
    }
    local_258[0x10] = 0;
    local_258._17_8_ = 0;
    local_258._0_8_ = (pointer)0x0;
    local_258[8] = 0;
    local_258._9_7_ = 0;
    memset(local_308,0,0xac);
    (anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_(&local_330,this);
    local_498._0_8_ = local_498._0_8_ & 0xffffffff00000000;
    local_498._8_8_ = &local_480;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_498 + 8),local_330._M_dataplus._M_p,
               local_330._M_dataplus._M_p + local_330._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_308 + (local_498._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_498 + 8)
               );
    (anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_(&local_350,this);
    __x = &vao.super_ObjectWrapper.m_traits;
    vao.super_ObjectWrapper.m_gl = (Functions *)CONCAT44(vao.super_ObjectWrapper.m_gl._4_4_,1);
    vao.super_ObjectWrapper.m_traits = (ObjectTraits *)&local_458;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__x,local_350._M_dataplus._M_p,
               local_350._M_dataplus._M_p + local_350._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_308 + ((ulong)vao.super_ObjectWrapper.m_gl & 0xffffffff) * 0x18),
                (value_type *)__x);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,
               "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices = 4) out;\n\nuniform highp float u_innerTessellationLevel;\nuniform highp float u_outerTessellationLevel;\nin highp vec4 v_vertex_color[];\nout highp vec4 v_patch_color[];\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\n"
               ,0x189);
    uVar14 = (ulong)this->m_case;
    if (uVar14 < 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,&DAT_009aafb0 + *(int *)(&DAT_009aafb0 + uVar14 * 4),
                 *(long *)(&DAT_009aafc0 + uVar14 * 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,"}\n",2);
    std::__cxx11::stringbuf::str();
    local_3b0._M_dataplus._M_p._0_4_ =
         (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
           _vptr_RenderContext[2])();
    specializeShader(&local_370,(string *)local_448,(ContextType *)&local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_448._4_4_,local_448._0_4_) != &local_438) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_448._4_4_,local_448._0_4_),
                      local_438._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    std::ios_base::~ios_base(local_1c8);
    local_418._0_4_ = 3;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_370._M_dataplus._M_p,
               local_370._M_dataplus._M_p + local_370._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_308 + (ulong)(uint)local_418._0_4_ * 0x18),(value_type *)(local_418 + 8));
    bVar3 = local_420->containsGeometryShader;
    pcVar16 = "v_fragment_color";
    if (bVar3 != false) {
      pcVar16 = "v_evaluated_color";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,"${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(",0x36);
    pcVar13 = "isolines";
    if (this->m_case == CASE_QUADS) {
      pcVar13 = "quads";
    }
    if (this->m_case == CASE_TRIANGLES) {
      pcVar13 = "triangles";
    }
    sVar9 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar13,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,") in;\n\nin highp vec4 v_patch_color[];\nout highp vec4 ",0x35);
    uVar14 = (ulong)bVar3 | 0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar16,uVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,
               ";\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n"
               ,0x6b);
    if (this->m_case - CASE_QUADS < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 "\tvec2 normalizedCoord = (gl_TessCoord.xy * 2.0 - vec2(1.0));\n\tvec2 normalizedWeights = normalizedCoord * (vec2(1.0) - 0.3 * cos(normalizedCoord.yx * 1.57));\n\tvec2 weights = normalizedWeights * 0.5 + vec2(0.5);\n\tvec2 cweights = gl_TessCoord.xy;\n\tgl_Position = mix(mix(gl_in[0].gl_Position, gl_in[1].gl_Position, weights.y), mix(gl_in[2].gl_Position, gl_in[3].gl_Position, weights.y), weights.x);\n\t"
                 ,0x18c);
      lVar15 = 0x7e;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar16,uVar14);
      pcVar16 = 
      " = mix(mix(v_patch_color[0], v_patch_color[1], cweights.y), mix(v_patch_color[2], v_patch_color[3], cweights.y), cweights.x);\n"
      ;
LAB_00571ea7:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar16,lVar15);
    }
    else if (this->m_case == CASE_TRIANGLES) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 "\tvec3 weights = vec3(pow(gl_TessCoord.x, 1.3), pow(gl_TessCoord.y, 1.3), pow(gl_TessCoord.z, 1.3));\n\tvec3 cweights = gl_TessCoord;\n\tgl_Position = vec4(weights.x * gl_in[0].gl_Position.xyz + weights.y * gl_in[1].gl_Position.xyz + weights.z * gl_in[2].gl_Position.xyz, 1.0);\n\t"
                 ,0x112);
      lVar15 = 0x62;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar16,uVar14);
      pcVar16 = 
      " = cweights.x * v_patch_color[0] + cweights.y * v_patch_color[1] + cweights.z * v_patch_color[2];\n"
      ;
      goto LAB_00571ea7;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,"}\n",2);
    std::__cxx11::stringbuf::str();
    local_3ec.super_ApiType.m_bits =
         (ApiType)(*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    specializeShader(&local_390,&local_3b0,&local_3ec);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p) !=
        &local_3b0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p),
                      local_3b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    std::ios_base::~ios_base(local_1c8);
    local_448._0_4_ = 4;
    local_448._8_8_ = local_438._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_448 + 8),local_390._M_dataplus._M_p,
               local_390._M_dataplus._M_p + local_390._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_308 + (ulong)(uint)local_448._0_4_ * 0x18),(value_type *)(local_448 + 8));
    if ((char *)local_448._8_8_ != local_438._M_local_buf + 8) {
      operator_delete((void *)local_448._8_8_,local_438._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vao.super_ObjectWrapper.m_traits != &local_458) {
      operator_delete(vao.super_ObjectWrapper.m_traits,local_458._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._8_8_ != &local_480) {
      operator_delete((void *)local_498._8_8_,local_480._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if (local_420->containsGeometryShader == true) {
      CVar1 = this->m_case;
      pcVar16 = "capture_vertex_triangle_strip";
      if (CVar1 == CASE_ISOLINES) {
        pcVar16 = "capture_vertex_line_strip";
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,"${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout(",0x33);
      pcVar13 = "triangles";
      if (CVar1 == CASE_ISOLINES) {
        pcVar13 = "lines";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,pcVar13,(ulong)(CVar1 != CASE_ISOLINES) * 4 + 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,") in;\nlayout(",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,pcVar16 + 0xf,(ulong)(CVar1 != CASE_ISOLINES) * 4 + 10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,", max_vertices=",0xf);
      poVar10 = (ostream *)
                std::ostream::operator<<((ostringstream *)&buf,CVar1 == CASE_ISOLINES ^ 3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 ") out;\n\nin highp vec4 v_evaluated_color[];\nout highp vec4 v_fragment_color;\n\nvoid main (void)\n{\n\tfor (int ndx = 0; ndx < gl_in.length(); ++ndx)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position;\n\t\tv_fragment_color = v_evaluated_color[ndx];\n\t\tEmitVertex();\n\t}\n}\n"
                 ,0xfd);
      std::__cxx11::stringbuf::str();
      local_448._0_4_ =
           (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[2])();
      specializeShader((string *)local_418,(string *)&vao,(ContextType *)local_448);
      if (vao.super_ObjectWrapper.m_gl != (Functions *)&vao.super_ObjectWrapper.m_object) {
        operator_delete(vao.super_ObjectWrapper.m_gl,
                        CONCAT44(vao.super_ObjectWrapper._20_4_,vao.super_ObjectWrapper.m_object) +
                        1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      std::ios_base::~ios_base(local_1c8);
      local_498._0_4_ = I;
      local_498._8_8_ = &local_480;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_498 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
                 (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_308 + (local_498._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_498 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._8_8_ != &local_480) {
        operator_delete((void *)local_498._8_8_,local_480._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_418._4_4_,local_418._0_4_),
                        local_408._M_allocated_capacity + 1);
      }
    }
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&buf,
               ((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,
               (ProgramSources *)local_308);
    iVar4 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
    glu::ObjectWrapper::ObjectWrapper
              (&vao.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar4),traits);
    iVar4 = (**(code **)(lVar8 + 0x780))(local_1a0,"a_position");
    iVar6 = (**(code **)(lVar8 + 0xb48))(local_1a0,"u_innerTessellationLevel");
    iVar7 = (**(code **)(lVar8 + 0xb48))(local_1a0,"u_outerTessellationLevel");
    glu::operator<<(((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log,(ShaderProgram *)&buf);
    if (local_178 == false) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      local_498._0_8_ = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"could not build program","");
      tcu::TestError::TestError(pTVar11,(string *)local_498);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar4 == -1) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      local_498._0_8_ = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"a_position location was -1","");
      tcu::TestError::TestError(pTVar11,(string *)local_498);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar7 == -1) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      local_498._0_8_ = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"u_outerTessellationLevel location was -1","");
      tcu::TestError::TestError(pTVar11,(string *)local_498);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar8 + 0xd8))(vao.super_ObjectWrapper.m_object);
    (**(code **)(lVar8 + 0x40))(0x8892,this->m_patchBuffer);
    (**(code **)(lVar8 + 0x19f0))(iVar4,4,0x1406,0,0,0);
    (**(code **)(lVar8 + 0x610))(iVar4);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"setup attribs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x121);
    (**(code **)(lVar8 + 0x1680))(local_1a0);
    (**(code **)(lVar8 + 0x14e0))(0x41600000,iVar7);
    if (iVar6 == -1) {
      (**(code **)(lVar8 + 0x14e0))(0x41600000,0xffffffff);
    }
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x129);
    (**(code **)(lVar8 + 0xfd8))(0x8e72,4 - (uint)(this->m_case == CASE_TRIANGLES));
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,300);
    (**(code **)(lVar8 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x12f);
    (**(code **)(lVar8 + 0x538))(0xe,0,4);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"draw patches",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x132);
    glu::readPixels(((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,0,0,
                    &local_420->surfaceAccess);
    glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&buf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_258);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_278);
    lVar15 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_308 + lVar15));
      lVar15 = lVar15 + -0x18;
    } while (lVar15 != -0x18);
    tcu::TestLog::endSection(section.m_log);
    lVar15 = local_310 + 1;
    if (local_310 != 0) {
      pTVar2 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      local_308._0_4_ = RGBA;
      local_308._4_4_ = UNORM_INT8;
      if (resultWithoutGeometry.m_pixels.m_cap != 0) {
        resultWithoutGeometry.m_pixels.m_cap = (size_t)resultWithoutGeometry.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&buf,(TextureFormat *)local_308,resultWithoutGeometry.m_width,
                 resultWithoutGeometry.m_height,1,(void *)resultWithoutGeometry.m_pixels.m_cap);
      local_498._0_4_ = RGBA;
      local_498._4_4_ = UNORM_INT8;
      if (resultWithGeometry.m_pixels.m_cap != 0) {
        resultWithGeometry.m_pixels.m_cap = (size_t)resultWithGeometry.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_308,(TextureFormat *)local_498,
                 resultWithGeometry.m_width,resultWithGeometry.m_height,1,
                 (void *)resultWithGeometry.m_pixels.m_cap);
      local_498._0_4_ = RGBA;
      local_498._4_4_ = UNORM_SHORT_565;
      local_498._8_8_ = 0xff00000008;
      vao.super_ObjectWrapper.m_gl = (Functions *)0x100000001;
      vao.super_ObjectWrapper.m_traits =
           (ObjectTraits *)((ulong)vao.super_ObjectWrapper.m_traits & 0xffffffff00000000);
      bVar3 = tcu::intThresholdPositionDeviationCompare
                        (pTVar2,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)&buf,
                         (ConstPixelBufferAccess *)local_308,(UVec4 *)local_498,(IVec3 *)&vao,true,
                         COMPARE_LOG_RESULT);
      pcVar16 = "Image comparison failed";
      if (bVar3) {
        pcVar16 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,(uint)!bVar3,pcVar16);
      tcu::Surface::~Surface(&resultWithoutGeometry);
      tcu::Surface::~Surface(&resultWithGeometry);
      return STOP;
    }
  } while( true );
}

Assistant:

IdentityGeometryShaderCase::IterateResult IdentityGeometryShaderCase::iterate (void)
{
	const float				innerTessellationLevel	= 14.0f;
	const float				outerTessellationLevel	= 14.0f;
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultWithGeometry		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface			resultWithoutGeometry	(RENDER_SIZE, RENDER_SIZE);

	const struct
	{
		const char*				name;
		const char*				description;
		bool					containsGeometryShader;
		tcu::PixelBufferAccess	surfaceAccess;
	} renderTargets[] =
	{
		{ "RenderWithGeometryShader",		"Render with geometry shader",		true,	resultWithGeometry.getAccess()		},
		{ "RenderWithoutGeometryShader",	"Render without geometry shader",	false,	resultWithoutGeometry.getAccess()	},
	};

	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set viewport");

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set blend");

	m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation level: inner " << innerTessellationLevel << ", outer " << outerTessellationLevel << tcu::TestLog::EndMessage;

	// render with and without geometry shader
	for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++renderNdx)
	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), renderTargets[renderNdx].name, renderTargets[renderNdx].description);
		glu::ProgramSources			sources;

		sources	<< glu::VertexSource(getVertexSource())
				<< glu::FragmentSource(getFragmentSource())
				<< glu::TessellationControlSource(getTessellationControlSource())
				<< glu::TessellationEvaluationSource(getTessellationEvaluationSource(renderTargets[renderNdx].containsGeometryShader));

		if (renderTargets[renderNdx].containsGeometryShader)
			sources << glu::GeometrySource(getGeometrySource());

		{
			const glu::ShaderProgram	program					(m_context.getRenderContext(), sources);
			const glu::VertexArray		vao						(m_context.getRenderContext());
			const int					posLocation				= gl.getAttribLocation(program.getProgram(), "a_position");
			const int					innerTessellationLoc	= gl.getUniformLocation(program.getProgram(), "u_innerTessellationLevel");
			const int					outerTessellationLoc	= gl.getUniformLocation(program.getProgram(), "u_outerTessellationLevel");

			m_testCtx.getLog() << program;

			if (!program.isOk())
				throw tcu::TestError("could not build program");
			if (posLocation == -1)
				throw tcu::TestError("a_position location was -1");
			if (outerTessellationLoc == -1)
				throw tcu::TestError("u_outerTessellationLevel location was -1");

			gl.bindVertexArray(*vao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_patchBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

			gl.useProgram(program.getProgram());
			gl.uniform1f(outerTessellationLoc, outerTessellationLevel);

			if (innerTessellationLoc == -1)
				gl.uniform1f(innerTessellationLoc, innerTessellationLevel);

			GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

			gl.patchParameteri(GL_PATCH_VERTICES, (m_case == CASE_TRIANGLES) ? (3): (4));
			GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.drawArrays(GL_PATCHES, 0, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw patches");

			glu::readPixels(m_context.getRenderContext(), 0, 0, renderTargets[renderNdx].surfaceAccess);
		}
	}

	if (tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
												  "ImageCompare",
												  "Image comparison",
												  resultWithoutGeometry.getAccess(),
												  resultWithGeometry.getAccess(),
												  tcu::UVec4(8, 8, 8, 255),
												  tcu::IVec3(1, 1, 0),
												  true,
												  tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}